

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void anon_unknown.dwarf_c6b42::OnMemoryLimitHit(void *context)

{
  undefined8 *puVar1;
  
  (**(code **)(**(long **)((long)context + 0x8a50) + 0x28))();
  puVar1 = *(undefined8 **)(*(long *)((long)context + 0x8158) + 0x18);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = *(undefined8 **)(*(long *)((long)context + 0x8a20) + 0x68);
  }
  Stop((ExpressionContext *)context,(SynBase *)*puVar1,
       "ERROR: memory limit (%u) reached during compilation (analyze stage)",
       (ulong)*(uint *)((long)context + 0x85e4));
}

Assistant:

void OnMemoryLimitHit(void *context)
	{
		ExpressionContext &ctx = *(ExpressionContext*)context;

		ctx.allocator->clear_limit();

		if(ctx.scope->ownerFunction)
			Stop(ctx, ctx.scope->ownerFunction->source, "ERROR: memory limit (%u) reached during compilation (analyze stage)", ctx.memoryLimit);
		else
			Stop(ctx, ctx.typeAutoRef->members.head->source, "ERROR: memory limit (%u) reached during compilation (analyze stage)", ctx.memoryLimit);
	}